

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compare.cpp
# Opt level: O0

bool compareData<int>(Serializer *serializer1,Serializer *serializer2,Savepoint *savepoint,
                     DataFieldInfo *info1,DataFieldInfo *info2,IJKLBounds *bounds,double tolerance,
                     vector<bool,_std::allocator<bool>_> *failed)

{
  byte local_b3;
  bool local_b2;
  bool local_b1;
  double local_b0;
  reference local_a8;
  bool local_91;
  double dStack_90;
  bool f;
  double err;
  double ref;
  double val;
  int index;
  int l;
  int k;
  int j;
  int i;
  int iStack_5c;
  bool notequal;
  int lSize;
  int kSize;
  int jSize;
  int iSize;
  int *data2;
  int *data1;
  double tolerance_local;
  IJKLBounds *bounds_local;
  DataFieldInfo *info2_local;
  DataFieldInfo *info1_local;
  Savepoint *savepoint_local;
  Serializer *serializer2_local;
  Serializer *serializer1_local;
  
  data1 = (int *)tolerance;
  tolerance_local = (double)bounds;
  bounds_local = (IJKLBounds *)info2;
  info2_local = info1;
  info1_local = (DataFieldInfo *)savepoint;
  savepoint_local = (Savepoint *)serializer2;
  serializer2_local = serializer1;
  readData<int>(serializer1,info1,savepoint,&data2);
  readData<int>((Serializer *)savepoint_local,(DataFieldInfo *)bounds_local,(Savepoint *)info1_local
                ,(int **)&jSize);
  kSize = ser::DataFieldInfo::iSize(info2_local);
  lSize = ser::DataFieldInfo::jSize(info2_local);
  iStack_5c = ser::DataFieldInfo::kSize(info2_local);
  i = ser::DataFieldInfo::lSize(info2_local);
  j._3_1_ = 0;
  std::vector<bool,_std::allocator<bool>_>::resize
            (failed,(long)(kSize * lSize * iStack_5c * i),false);
  for (k = *(int *)tolerance_local; k <= *(int *)((long)tolerance_local + 4); k = k + 1) {
    for (l = *(int *)((long)tolerance_local + 8); l <= *(int *)((long)tolerance_local + 0xc);
        l = l + 1) {
      for (index = *(int *)((long)tolerance_local + 0x10);
          index <= *(int *)((long)tolerance_local + 0x14); index = index + 1) {
        for (val._4_4_ = *(int *)((long)tolerance_local + 0x18);
            val._4_4_ <= *(int *)((long)tolerance_local + 0x1c); val._4_4_ = val._4_4_ + 1) {
          val._0_4_ = k * lSize * iStack_5c * i + l * iStack_5c * i + index * i + val._4_4_;
          ref = (double)data2[val._0_4_];
          err = (double)_jSize[val._0_4_];
          if (ABS(err) <= 1.0) {
            local_b0 = err - ref;
          }
          else {
            local_b0 = (err - ref) / err;
          }
          local_b0 = ABS(local_b0);
          dStack_90 = local_b0;
          local_b1 = true;
          if (local_b0 <= (double)data1) {
            local_b2 = NAN(local_b0) && err != ref;
            local_b1 = local_b2;
          }
          local_91 = local_b1;
          local_a8 = std::vector<bool,_std::allocator<bool>_>::operator[](failed,(long)val._0_4_);
          std::_Bit_reference::operator=(&local_a8,local_b1);
          local_b3 = 1;
          if ((j._3_1_ & 1) == 0) {
            local_b3 = local_91;
          }
          j._3_1_ = local_b3 & 1;
        }
      }
    }
  }
  if (data2 != (int *)0x0) {
    operator_delete__(data2);
  }
  if (_jSize != (int *)0x0) {
    operator_delete__(_jSize);
  }
  return (bool)((j._3_1_ ^ 0xff) & 1);
}

Assistant:

bool compareData(const Serializer& serializer1, const Serializer& serializer2,
                 const Savepoint& savepoint,
                 const DataFieldInfo& info1, const DataFieldInfo& info2,
                 const IJKLBounds& bounds,
                 double tolerance, vector<bool>& failed)
{
    T* data1;
    readData(serializer1, info1, savepoint, data1);

    T* data2;
    readData(serializer2, info2, savepoint, data2);

    int iSize = info1.iSize();
    int jSize = info1.jSize();
    int kSize = info1.kSize();
    int lSize = info1.lSize();

    bool notequal = false;
    failed.resize(iSize * jSize * kSize * lSize);

    for (int i = bounds.iLower; i <= bounds.iUpper; ++i) {
        for (int j = bounds.jLower; j <= bounds.jUpper; ++j) {
            for (int k = bounds.kLower; k <= bounds.kUpper; ++k) {
                for (int l = bounds.lLower; l <= bounds.lUpper; ++l) {
                    int index = i * jSize * kSize * lSize + j * kSize * lSize + k * lSize + l;

                    const double val = static_cast<double>(data1[index]);
                    const double ref = static_cast<double>(data2[index]);
                    const double err = std::fabs(ref) > 1. ?
                                       std::fabs((ref - val) / ref) : std::fabs(ref - val);

                    const bool f = err > tolerance         // Error is too large (e.g. val is infinite, ref is not)
                        || ((val != val) != (ref != ref))  // Exactly one is NaN
                        || (err != err && ref != val);     // ref is infinite, val different

                    failed[index] = f;
                    notequal = notequal || f;
                }
            }
        }
    }

    delete [] data1;
    delete [] data2;

    return !notequal;
}